

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall Logger::Logger(Logger *this,char *fileName,int line)

{
  allocator local_21;
  
  memset(this,0,0xfb0);
  (this->impl_).stream_.buffer_.cur_ = (this->impl_).stream_.buffer_.data_;
  (this->impl_).line_ = line;
  std::__cxx11::string::string((string *)&(this->impl_).basename_,fileName,&local_21);
  Impl::formatTime(&this->impl_);
  return;
}

Assistant:

Logger::Logger(const char *fileName, int line)
  : impl_(fileName, line)
{  
    //printf("Class Logger num:%d Created!\n",++ClassNum_);
}